

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Parser::parseValue(Parser *this,Builder *output)

{
  bool bVar1;
  char cVar2;
  StringPtr SVar3;
  ArrayPtr<const_char> expected;
  Fault local_c0;
  Fault f_1;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  Fault local_50;
  Fault f;
  bool local_32;
  DebugExpression<bool> local_31;
  Type TStack_30;
  DebugExpression<bool> _kjCondition;
  undefined1 local_28 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:650:5)>
  _kjDefer650;
  Builder *output_local;
  Parser *this_local;
  
  _kjDefer650.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:650:5)>_2
        )output;
  Input::consumeWhitespace(&this->input);
  TStack_30.this = this;
  kj::
  defer<capnp::(anonymous_namespace)::Parser::parseValue(capnp::json::Value::Builder&)::_lambda()_1_>
            ((kj *)local_28,&stack0xffffffffffffffd0);
  bVar1 = Input::exhausted(&this->input);
  local_32 = (bool)(~bVar1 & 1);
  local_31 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_32);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_31);
  if (bVar1) {
    cVar2 = Input::nextChar(&this->input);
    switch(cVar2) {
    case '\"':
      parseString(this,(Builder *)_kjDefer650.maybeFunc.ptr.field_1);
      break;
    default:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                (&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x298,FAILED,(char *)0x0,"\"Unexpected input in JSON message.\"",
                 (char (*) [34])"Unexpected input in JSON message.");
      kj::_::Debug::Fault::fatal(&local_c0);
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      parseNumber(this,(Builder *)_kjDefer650.maybeFunc.ptr.field_1);
      break;
    case '[':
      parseArray(this,(Builder *)_kjDefer650.maybeFunc.ptr.field_1);
      break;
    case 'f':
      local_98 = (ArrayPtr<const_char>)operator____kj("false",5);
      local_88 = kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_98);
      Input::consume(&this->input,local_88);
      json::Value::Builder::setBoolean((Builder *)_kjDefer650.maybeFunc.ptr.field_1,false);
      break;
    case 'n':
      local_70 = (ArrayPtr<const_char>)operator____kj("null",4);
      local_60 = kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_70);
      Input::consume(&this->input,local_60);
      json::Value::Builder::setNull((Builder *)_kjDefer650.maybeFunc.ptr.field_1);
      break;
    case 't':
      SVar3 = operator____kj("true",4);
      f_1.exception = (Exception *)SVar3.content.ptr;
      expected = kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&f_1);
      Input::consume(&this->input,expected);
      json::Value::Builder::setBoolean((Builder *)_kjDefer650.maybeFunc.ptr.field_1,true);
      break;
    case '{':
      parseObject(this,(Builder *)_kjDefer650.maybeFunc.ptr.field_1);
    }
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++:650:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:650:5)>
                 *)local_28);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
            (&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x28c,FAILED,"!input.exhausted()","_kjCondition,\"JSON message ends prematurely.\"",
             &local_31,(char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&local_50);
}

Assistant:

void parseValue(JsonValue::Builder& output) {
    input.consumeWhitespace();
    KJ_DEFER(input.consumeWhitespace());

    KJ_REQUIRE(!input.exhausted(), "JSON message ends prematurely.");

    switch (input.nextChar()) {
      case 'n': input.consume("null"_kj);  output.setNull();         break;
      case 'f': input.consume("false"_kj); output.setBoolean(false); break;
      case 't': input.consume("true"_kj);  output.setBoolean(true);  break;
      case '"': parseString(output); break;
      case '[': parseArray(output);  break;
      case '{': parseObject(output); break;
      case '-': case '0': case '1': case '2': case '3':
      case '4': case '5': case '6': case '7': case '8':
      case '9': parseNumber(output); break;
      default: KJ_FAIL_REQUIRE("Unexpected input in JSON message.");
    }
  }